

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  uint uVar1;
  uint uVar2;
  ArrayPtr<const_char> AVar3;
  StructReader local_80;
  PointerReader local_50;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  if ((decl->_reader).pointerCount == 0) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.segment = (decl->_reader).segment;
    local_50.capTable = (decl->_reader).capTable;
    local_50.pointer = (decl->_reader).pointers;
    local_50.nestingLimit = (decl->_reader).nestingLimit;
  }
  _::PointerReader::getStruct(&local_80,&local_50,(word *)0x0);
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  local_50.capTable = (CapTableReader *)0x0;
  local_50.nestingLimit = 0x7fffffff;
  if (local_80.pointerCount != 0) {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.pointers._4_4_,(int)local_80.pointers);
    local_50.segment = local_80.segment;
    local_50.capTable = local_80.capTable;
    local_50.nestingLimit = local_80.nestingLimit;
  }
  uVar2 = 0;
  AVar3 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  (this->name).content = AVar3;
  *(undefined8 *)((long)&(this->declId)._reader.pointers + 6) = 0;
  (this->declId)._reader.data = (void *)0x0;
  (this->declId)._reader.pointers = (WirePointer *)0x0;
  (this->declId)._reader.segment = (SegmentReader *)0x0;
  (this->declId)._reader.capTable = (CapTableReader *)0x0;
  local_80.pointers._0_4_ = 0x7fffffff;
  (this->declId)._reader.nestingLimit = 0x7fffffff;
  this->declKind = FIELD;
  this->isParam = true;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_80.capTable = (CapTableReader *)0x0;
  local_80.data = (WirePointer *)0x0;
  local_80.segment = (SegmentReader *)0x0;
  if (2 < (decl->_reader).pointerCount) {
    local_80.segment = (decl->_reader).segment;
    local_80.capTable = (decl->_reader).capTable;
    local_80.data = (decl->_reader).pointers + 2;
    local_80.pointers._0_4_ = (decl->_reader).nestingLimit;
  }
  _::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)&local_80,INLINE_COMPOSITE,(word *)0x0
            );
  uVar1 = (decl->_reader).dataSize;
  if (0x3f < uVar1) {
    uVar2 = *(uint *)((long)(decl->_reader).data + 4);
  }
  this->startByte = uVar2;
  uVar2 = 0;
  if (0x5f < uVar1) {
    uVar2 = *(uint *)((long)(decl->_reader).data + 8);
  }
  this->endByte = uVar2;
  local_50.capTable = (CapTableReader *)0x0;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  if ((decl->_reader).pointerCount < 2) {
    local_50.nestingLimit = 0x7fffffff;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
  }
  else {
    local_50.segment = (decl->_reader).segment;
    local_50.capTable = (decl->_reader).capTable;
    local_50.pointer = (decl->_reader).pointers + 1;
    local_50.nestingLimit = (decl->_reader).nestingLimit;
  }
  _::PointerReader::getStruct(&local_80,&local_50,(word *)0x0);
  (this->fieldType)._reader.dataSize = local_80.dataSize;
  (this->fieldType)._reader.pointerCount = local_80.pointerCount;
  *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_80._38_2_;
  *(ulong *)&(this->fieldType)._reader.nestingLimit =
       CONCAT44(local_80._44_4_,local_80.nestingLimit);
  (this->fieldType)._reader.data = local_80.data;
  (this->fieldType)._reader.pointers =
       (WirePointer *)CONCAT44(local_80.pointers._4_4_,(int)local_80.pointers);
  (this->fieldType)._reader.segment = local_80.segment;
  (this->fieldType)._reader.capTable = local_80.capTable;
  if ((0xf < (decl->_reader).dataSize) && (*(decl->_reader).data == 1)) {
    this->hasDefaultValue = true;
    if ((decl->_reader).pointerCount < 4) {
      local_50.nestingLimit = 0x7fffffff;
      local_50.capTable = (CapTableReader *)0x0;
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)0x0;
    }
    else {
      local_50.nestingLimit = (decl->_reader).nestingLimit;
      local_50.segment = (decl->_reader).segment;
      local_50.capTable = (decl->_reader).capTable;
      local_50.pointer = (decl->_reader).pointers + 3;
    }
    _::PointerReader::getStruct(&local_80,&local_50,(word *)0x0);
    (this->fieldDefaultValue)._reader.dataSize = local_80.dataSize;
    (this->fieldDefaultValue)._reader.pointerCount = local_80.pointerCount;
    *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = local_80._38_2_;
    *(ulong *)&(this->fieldDefaultValue)._reader.nestingLimit =
         CONCAT44(local_80._44_4_,local_80.nestingLimit);
    (this->fieldDefaultValue)._reader.data = local_80.data;
    (this->fieldDefaultValue)._reader.pointers =
         (WirePointer *)CONCAT44(local_80.pointers._4_4_,(int)local_80.pointers);
    (this->fieldDefaultValue)._reader.segment = local_80.segment;
    (this->fieldDefaultValue)._reader.capTable = local_80.capTable;
  }
  return;
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Param::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declKind(Declaration::FIELD), isParam(true),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      fieldType = decl.getType();
      if (decl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = decl.getDefaultValue().getValue();
      }
    }